

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Term.cpp
# Opt level: O0

void __thiscall Kernel::Term::Term(Term *this)

{
  TermList *pTVar1;
  TermList *pTVar2;
  TermList *in_RDI;
  uint val;
  TermList *local_10;
  
  in_RDI->_content = (uint64_t)&PTR_computable_013201f8;
  *(undefined4 *)&in_RDI[1]._content = 0;
  *(uint *)((long)&in_RDI[1]._content + 4) = *(uint *)((long)&in_RDI[1]._content + 4) & 0xf0000000;
  *(uint *)((long)&in_RDI[1]._content + 4) = *(uint *)((long)&in_RDI[1]._content + 4) & 0xcfffffff;
  *(uint *)((long)&in_RDI[1]._content + 4) = *(uint *)((long)&in_RDI[1]._content + 4) & 0xbfffffff;
  *(uint *)((long)&in_RDI[1]._content + 4) = *(uint *)((long)&in_RDI[1]._content + 4) & 0x7fffffff;
  *(undefined4 *)&in_RDI[2]._content = 0;
  *(undefined4 *)((long)&in_RDI[2]._content + 4) = 0xffffffff;
  *(undefined4 *)&in_RDI[3]._content = 0;
  *(undefined4 *)&in_RDI[4]._content = 0;
  pTVar2 = in_RDI + 6;
  pTVar1 = in_RDI + 5;
  do {
    local_10 = pTVar1;
    TermList::TermList(local_10);
    pTVar1 = local_10 + 1;
  } while (local_10 + 1 != pTVar2);
  TermList::setContent(in_RDI + 5,0);
  val = (uint)((ulong)local_10 >> 0x20);
  TermList::_setTag(in_RDI,val);
  TermList::_setDistinctVars(in_RDI,val);
  return;
}

Assistant:

Term::Term() throw()
  :_functor(0),
   _arity(0),
   _color(COLOR_TRANSPARENT),
   _hasInterpretedConstants(0),
   _isTwoVarEquality(0),
   _weight(0),
   _kboWeight(-1),
#if VDEBUG
   _kboInstance(nullptr),
#endif
   _maxRedLen(0),
   _vars(0)
{
  _args[0].setContent(0);
  _args[0]._setTag(FUN);
  _args[0]._setDistinctVars(TERM_DIST_VAR_UNKNOWN);
}